

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O0

bool __thiscall rotate_y::hit(rotate_y *this,ray *r,interval ray_t,hit_record *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  point3 *ppVar6;
  vec3 *pvVar7;
  element_type *peVar8;
  ray *__timer;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double time;
  vec3 local_e0;
  vec3 local_c8;
  double local_b0;
  double local_a8;
  undefined1 local_a0 [8];
  ray rotated_r;
  vec3 direction;
  point3 origin;
  hit_record *rec_local;
  ray *r_local;
  rotate_y *this_local;
  interval ray_t_local;
  
  dVar1 = this->cos_theta;
  __timer = r;
  ppVar6 = ray::origin(r);
  dVar10 = vec3::x(ppVar6);
  dVar2 = this->sin_theta;
  ppVar6 = ray::origin(r);
  dVar11 = vec3::z(ppVar6);
  ppVar6 = ray::origin(r);
  dVar12 = vec3::y(ppVar6);
  dVar3 = this->sin_theta;
  ppVar6 = ray::origin(r);
  dVar13 = vec3::x(ppVar6);
  dVar4 = this->cos_theta;
  ppVar6 = ray::origin(r);
  dVar14 = vec3::z(ppVar6);
  vec3::vec3((vec3 *)(direction.e + 2),dVar1 * dVar10 + -(dVar2 * dVar11),dVar12,
             dVar3 * dVar13 + dVar4 * dVar14);
  dVar1 = this->cos_theta;
  pvVar7 = ray::direction(r);
  dVar10 = vec3::x(pvVar7);
  dVar2 = this->sin_theta;
  pvVar7 = ray::direction(r);
  dVar11 = vec3::z(pvVar7);
  pvVar7 = ray::direction(r);
  dVar12 = vec3::y(pvVar7);
  dVar3 = this->sin_theta;
  pvVar7 = ray::direction(r);
  dVar13 = vec3::x(pvVar7);
  dVar4 = this->cos_theta;
  pvVar7 = ray::direction(r);
  dVar14 = vec3::z(pvVar7);
  vec3::vec3((vec3 *)&rotated_r.tm,dVar1 * dVar10 + -(dVar2 * dVar11),dVar12,
             dVar3 * dVar13 + dVar4 * dVar14);
  ray::time(r,(time_t *)__timer);
  ray::ray((ray *)local_a0,(point3 *)(direction.e + 2),(vec3 *)&rotated_r.tm,time);
  peVar8 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->object);
  local_b0 = ray_t.min;
  local_a8 = ray_t.max;
  uVar5 = (*peVar8->_vptr_hittable[2])(ray_t.min,ray_t.max,peVar8,local_a0,rec);
  bVar9 = (uVar5 & 1) != 0;
  if (bVar9) {
    dVar1 = this->cos_theta;
    dVar10 = vec3::x(&rec->p);
    dVar2 = this->sin_theta;
    dVar11 = vec3::z(&rec->p);
    dVar12 = vec3::y(&rec->p);
    dVar3 = this->sin_theta;
    dVar13 = vec3::x(&rec->p);
    dVar4 = this->cos_theta;
    dVar14 = vec3::z(&rec->p);
    vec3::vec3(&local_c8,dVar1 * dVar10 + dVar2 * dVar11,dVar12,-dVar3 * dVar13 + dVar4 * dVar14);
    (rec->p).e[0] = local_c8.e[0];
    (rec->p).e[1] = local_c8.e[1];
    (rec->p).e[2] = local_c8.e[2];
    dVar1 = this->cos_theta;
    dVar10 = vec3::x(&rec->normal);
    dVar2 = this->sin_theta;
    dVar11 = vec3::z(&rec->normal);
    dVar12 = vec3::y(&rec->normal);
    dVar3 = this->sin_theta;
    dVar13 = vec3::x(&rec->normal);
    dVar4 = this->cos_theta;
    dVar14 = vec3::z(&rec->normal);
    vec3::vec3(&local_e0,dVar1 * dVar10 + dVar2 * dVar11,dVar12,-dVar3 * dVar13 + dVar4 * dVar14);
    (rec->normal).e[0] = local_e0.e[0];
    (rec->normal).e[1] = local_e0.e[1];
    (rec->normal).e[2] = local_e0.e[2];
  }
  return bVar9;
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {

        // Transform the ray from world space to object space.

        auto origin = point3(
            (cos_theta * r.origin().x()) - (sin_theta * r.origin().z()),
            r.origin().y(),
            (sin_theta * r.origin().x()) + (cos_theta * r.origin().z())
        );

        auto direction = vec3(
            (cos_theta * r.direction().x()) - (sin_theta * r.direction().z()),
            r.direction().y(),
            (sin_theta * r.direction().x()) + (cos_theta * r.direction().z())
        );

        ray rotated_r(origin, direction, r.time());

        // Determine whether an intersection exists in object space (and if so, where).

        if (!object->hit(rotated_r, ray_t, rec))
            return false;

        // Transform the intersection from object space back to world space.

        rec.p = point3(
            (cos_theta * rec.p.x()) + (sin_theta * rec.p.z()),
            rec.p.y(),
            (-sin_theta * rec.p.x()) + (cos_theta * rec.p.z())
        );

        rec.normal = vec3(
            (cos_theta * rec.normal.x()) + (sin_theta * rec.normal.z()),
            rec.normal.y(),
            (-sin_theta * rec.normal.x()) + (cos_theta * rec.normal.z())
        );

        return true;
    }